

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

Array * __thiscall notch::core::ActivationLayer::backprop(ActivationLayer *this,Array *errors)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  Array *errors_local;
  ActivationLayer *this_local;
  
  SharedBuffers::allocate(&(this->super_ABackpropLayer).shared,this->nSize,this->nSize);
  bVar2 = SharedBuffers::ready(&(this->super_ABackpropLayer).shared);
  if (!bVar2) {
    __assert_fail("shared.ready()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x75e,"virtual const Array &notch::ActivationLayer::backprop(const Array &)");
  }
  sVar1 = this->nSize;
  sVar3 = std::valarray<float>::size(errors);
  if (sVar1 == sVar3) {
    (*(this->super_ABackpropLayer)._vptr_ABackpropLayer[0x11])(this,errors);
    return &this->propagatedErrors;
  }
  __assert_fail("nSize == errors.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x75f,"virtual const Array &notch::ActivationLayer::backprop(const Array &)");
}

Assistant:

virtual const Array &backprop(const Array &errors) {
        shared.allocate(nSize, nSize); // just in case user didn't init()
        assert (shared.ready());
        assert (nSize == errors.size());
        backpropInplace(errors);
        return propagatedErrors;
    }